

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

bool __thiscall
QGraphicsScenePrivate::dispatchHoverEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneHoverEvent *hoverEvent)

{
  QList<QGraphicsItem_*> *this_00;
  qsizetype *pqVar1;
  QGraphicsItem **ppQVar2;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  QWidget *widget;
  QGraphicsScenePrivate *pQVar6;
  iterator iVar7;
  QGraphicsScenePrivate *pQVar8;
  QGraphicsItem *pQVar9;
  QGraphicsItem *pQVar10;
  int iVar11;
  QGraphicsScenePrivate *item;
  long lVar12;
  long lVar13;
  int iVar14;
  QGraphicsItem **ppQVar15;
  long in_FS_OFFSET;
  QPointF QVar16;
  QGraphicsScenePrivate *local_88;
  QPointF local_70;
  QPoint local_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0xb9 & 0x10) != 0) {
    bVar4 = false;
    goto LAB_00606882;
  }
  lVar12 = (this->cachedItemsUnderMouse).d.size;
  pQVar8 = this;
  if (lVar12 == 0) {
    pQVar8 = (QGraphicsScenePrivate *)&this->cachedItemsUnderMouse;
    local_60 = QGraphicsSceneHoverEvent::screenPos(hoverEvent);
    QVar16 = QGraphicsSceneHoverEvent::scenePos(hoverEvent);
    local_70.yp = QVar16.yp;
    local_70.xp = QVar16.xp;
    widget = QGraphicsSceneEvent::widget(&hoverEvent->super_QGraphicsSceneEvent);
    itemsAtPosition((QList<QGraphicsItem_*> *)&local_58,this,&local_60,&local_70,widget);
    QArrayDataPointer<QGraphicsItem_*>::operator=
              ((QArrayDataPointer<QGraphicsItem_*> *)pQVar8,&local_58);
    if ((QGraphicsScenePrivate *)local_58.d != (QGraphicsScenePrivate *)0x0) {
      LOCK();
      *(int *)local_58.d = *(int *)local_58.d + -1;
      UNLOCK();
      if (*(int *)local_58.d == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
        pQVar8 = (QGraphicsScenePrivate *)local_58.d;
      }
    }
    lVar12 = (this->cachedItemsUnderMouse).d.size;
    if (lVar12 == 0) {
      bVar4 = true;
      item = (QGraphicsScenePrivate *)0x0;
      goto LAB_00606719;
    }
  }
  ppQVar15 = (this->cachedItemsUnderMouse).d.ptr;
  ppQVar2 = ppQVar15 + lVar12;
  local_88 = (QGraphicsScenePrivate *)0x0;
  do {
    item = (QGraphicsScenePrivate *)*ppQVar15;
    bVar4 = itemAcceptsHoverEvents_helper(pQVar8,(QGraphicsItem *)item);
    if (bVar4) {
      bVar4 = item == (QGraphicsScenePrivate *)0x0;
      if (bVar4) {
        item = (QGraphicsScenePrivate *)0x0;
        bVar4 = true;
        goto LAB_00606719;
      }
      lVar12 = (this->hoverItems).d.size;
      if ((lVar12 != 0) &&
         (pQVar8 = item,
         local_88 = (QGraphicsScenePrivate *)
                    QGraphicsItem::commonAncestorItem
                              ((QGraphicsItem *)item,(this->hoverItems).d.ptr[lVar12 + -1]),
         local_88 != (QGraphicsScenePrivate *)0x0)) goto LAB_006066d3;
      bVar4 = false;
      goto LAB_00606719;
    }
    ppQVar15 = ppQVar15 + 1;
  } while (ppQVar15 != ppQVar2);
  bVar4 = true;
  item = (QGraphicsScenePrivate *)0x0;
  iVar11 = -1;
  goto LAB_00606721;
  while (pQVar6 = (QGraphicsScenePrivate *)QGraphicsItem::parentItem((QGraphicsItem *)local_88),
        pQVar8 = local_88, local_88 = pQVar6, pQVar6 != (QGraphicsScenePrivate *)0x0) {
LAB_006066d3:
    bVar5 = itemAcceptsHoverEvents_helper(pQVar8,(QGraphicsItem *)local_88);
    if (bVar5) {
      pQVar9 = QGraphicsItem::panel((QGraphicsItem *)local_88);
      pQVar10 = QGraphicsItem::panel((QGraphicsItem *)item);
      if (pQVar9 == pQVar10) {
        lVar12 = (this->hoverItems).d.size;
        iVar11 = -1;
        if (lVar12 == 0) goto LAB_00606721;
        lVar13 = 0;
        iVar14 = -1;
        goto LAB_0060690b;
      }
      break;
    }
  }
LAB_00606719:
  local_88 = (QGraphicsScenePrivate *)0x0;
  iVar11 = -1;
  goto LAB_00606721;
  while( true ) {
    iVar11 = iVar14 + 1;
    plVar3 = (long *)((long)(this->hoverItems).d.ptr + lVar13);
    lVar13 = lVar13 + 8;
    iVar14 = iVar11;
    if ((QGraphicsScenePrivate *)*plVar3 == local_88) break;
LAB_0060690b:
    iVar11 = -1;
    if (lVar12 << 3 == lVar13) break;
  }
LAB_00606721:
  this_00 = &this->hoverItems;
  iVar14 = (int)(this->hoverItems).d.size;
  while (iVar14 = iVar14 + -1, iVar11 < iVar14) {
    pQVar8 = (QGraphicsScenePrivate *)this_00;
    iVar7 = QList<QGraphicsItem_*>::end(this_00);
    pQVar9 = iVar7.i[-1];
    pqVar1 = &(this->hoverItems).d.size;
    *pqVar1 = *pqVar1 + -1;
    bVar5 = itemAcceptsHoverEvents_helper(pQVar8,pQVar9);
    if (bVar5) {
      sendHoverEvent(this,GraphicsSceneHoverLeave,pQVar9,hoverEvent);
    }
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QGraphicsItem **)0x0;
  local_58.size = 0;
  if ((item != (QGraphicsScenePrivate *)0x0) && (item != local_88)) {
    pQVar8 = item;
    do {
      local_70.xp = (qreal)pQVar8;
      QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                ((QPodArrayOps<QGraphicsItem*> *)&local_58,local_58.size,(QGraphicsItem **)&local_70
                );
      QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)&local_58);
      bVar5 = QGraphicsItem::isPanel((QGraphicsItem *)pQVar8);
      if ((bVar5) ||
         (pQVar8 = (QGraphicsScenePrivate *)QGraphicsItem::parentItem((QGraphicsItem *)pQVar8),
         pQVar8 == (QGraphicsScenePrivate *)0x0)) break;
    } while (pQVar8 != local_88);
    ppQVar2 = local_58.ptr;
    if (local_58.size != 0) {
      lVar12 = local_58.size << 3;
      do {
        pQVar8 = *(QGraphicsScenePrivate **)((long)ppQVar2 + lVar12 + -8);
        local_70.xp = (qreal)pQVar8;
        QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                  ((QPodArrayOps<QGraphicsItem*> *)this_00,(this->hoverItems).d.size,
                   (QGraphicsItem **)&local_70);
        pQVar6 = (QGraphicsScenePrivate *)this_00;
        QList<QGraphicsItem_*>::end(this_00);
        bVar5 = itemAcceptsHoverEvents_helper(pQVar6,(QGraphicsItem *)pQVar8);
        if (bVar5) {
          sendHoverEvent(this,GraphicsSceneHoverEnter,(QGraphicsItem *)pQVar8,hoverEvent);
        }
        lVar12 = lVar12 + -8;
      } while (lVar12 != 0);
    }
  }
  if (((bVar4) || (lVar12 = (this->hoverItems).d.size, lVar12 == 0)) ||
     (item != (QGraphicsScenePrivate *)(this->hoverItems).d.ptr[lVar12 + -1])) {
    bVar4 = false;
  }
  else {
    sendHoverEvent(this,GraphicsSceneHoverMove,(QGraphicsItem *)item,hoverEvent);
    bVar4 = true;
  }
  if ((QGraphicsScenePrivate *)local_58.d != (QGraphicsScenePrivate *)0x0) {
    LOCK();
    *(int *)local_58.d = *(int *)local_58.d + -1;
    UNLOCK();
    if (*(int *)local_58.d == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
    }
  }
LAB_00606882:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QGraphicsScenePrivate::dispatchHoverEvent(QGraphicsSceneHoverEvent *hoverEvent)
{
    if (allItemsIgnoreHoverEvents)
        return false;

    // Find the first item that accepts hover events, reusing earlier
    // calculated data is possible.
    if (cachedItemsUnderMouse.isEmpty()) {
        cachedItemsUnderMouse = itemsAtPosition(hoverEvent->screenPos(),
                                                hoverEvent->scenePos(),
                                                hoverEvent->widget());
    }

    QGraphicsItem *item = nullptr;
    for (auto tmp : std::as_const(cachedItemsUnderMouse)) {
        if (itemAcceptsHoverEvents_helper(tmp)) {
            item = tmp;
            break;
        }
    }

    // Find the common ancestor item for the new topmost hoverItem and the
    // last item in the hoverItem list.
    QGraphicsItem *commonAncestorItem = (item && !hoverItems.isEmpty()) ? item->commonAncestorItem(hoverItems.constLast()) : nullptr;
    while (commonAncestorItem && !itemAcceptsHoverEvents_helper(commonAncestorItem))
        commonAncestorItem = commonAncestorItem->parentItem();
    if (commonAncestorItem && commonAncestorItem->panel() != item->panel()) {
        // The common ancestor isn't in the same panel as the two hovered
        // items.
        commonAncestorItem = nullptr;
    }

    // Check if the common ancestor item is known.
    int index = commonAncestorItem ? hoverItems.indexOf(commonAncestorItem) : -1;
    // Send hover leaves to any existing hovered children of the common
    // ancestor item.
    for (int i = hoverItems.size() - 1; i > index; --i) {
        QGraphicsItem *lastItem = hoverItems.takeLast();
        if (itemAcceptsHoverEvents_helper(lastItem))
            sendHoverEvent(QEvent::GraphicsSceneHoverLeave, lastItem, hoverEvent);
    }

    // Item is a child of a known item. Generate enter events for the
    // missing links.
    QList<QGraphicsItem *> parents;
    QGraphicsItem *parent = item;
    while (parent && parent != commonAncestorItem) {
        parents.append(parent);
        if (parent->isPanel()) {
            // Stop at the panel - we don't deliver beyond this point.
            break;
        }
        parent = parent->parentItem();
    }
    for (auto it = parents.crbegin(), end = parents.crend(); it != end; ++it) {
        QGraphicsItem *parent = *it;
        hoverItems << parent;
        if (itemAcceptsHoverEvents_helper(parent))
            sendHoverEvent(QEvent::GraphicsSceneHoverEnter, parent, hoverEvent);
    }

    // Generate a move event for the item itself
    if (item
        && !hoverItems.isEmpty()
        && item == hoverItems.constLast()) {
        sendHoverEvent(QEvent::GraphicsSceneHoverMove, item, hoverEvent);
        return true;
    }
    return false;
}